

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::write_pointer<unsigned_long>
          (basic_writer<fmt::v6::buffer_range<char>_> *this,unsigned_long value,format_specs *specs)

{
  char *pcVar1;
  buffer<char> *pbVar2;
  size_t sVar3;
  unsigned_long uVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  bool bVar9;
  format_specs specs_copy;
  pointer_writer<unsigned_long> pw;
  format_specs local_48;
  pointer_writer<unsigned_long> local_38;
  
  uVar4 = value;
  lVar6 = 1;
  do {
    lVar5 = lVar6;
    lVar6 = lVar5 + 1;
    bVar9 = 0xf < uVar4;
    uVar4 = uVar4 >> 4;
  } while (bVar9);
  local_38.num_digits = (int)lVar5;
  local_38.value = value;
  if (specs == (format_specs *)0x0) {
    pbVar2 = (this->out_).container;
    sVar3 = pbVar2->size_;
    uVar8 = lVar6 + sVar3 + 1;
    if (pbVar2->capacity_ < uVar8) {
      (**pbVar2->_vptr_buffer)(pbVar2,uVar8);
    }
    pbVar2->size_ = uVar8;
    pcVar7 = pbVar2->ptr_;
    pcVar1 = pcVar7 + sVar3;
    pcVar1[0] = '0';
    pcVar1[1] = 'x';
    pcVar7 = pcVar7 + lVar6 + sVar3;
    do {
      *pcVar7 = "0123456789abcdef"[(uint)value & 0xf];
      pcVar7 = pcVar7 + -1;
      bVar9 = 0xf < value;
      value = value >> 4;
    } while (bVar9);
  }
  else {
    local_48.width = specs->width;
    local_48.precision = specs->precision;
    local_48.type = specs->type;
    local_48._9_1_ = specs->field_0x9;
    local_48.fill.data_ = specs->fill;
    if ((local_48._8_8_ & 0xf00) == 0) {
      local_48._8_8_ = local_48._8_8_ | 0x200;
    }
    basic_writer<fmt::v6::buffer_range<char>>::
    write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::pointer_writer<unsigned_long>&>
              ((basic_writer<fmt::v6::buffer_range<char>> *)this,&local_48,&local_38);
  }
  return;
}

Assistant:

void write_pointer(UIntPtr value, const format_specs* specs) {
    int num_digits = count_digits<4>(value);
    auto pw = pointer_writer<UIntPtr>{value, num_digits};
    if (!specs) return pw(reserve(to_unsigned(num_digits) + 2));
    format_specs specs_copy = *specs;
    if (specs_copy.align == align::none) specs_copy.align = align::right;
    write_padded(specs_copy, pw);
  }